

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::
visit_depth_all<transwarp::detail::add_listener_per_event_visitor>
          (task_impl_base<_1a67ba37_> *this,add_listener_per_event_visitor *visitor)

{
  pointer ppiVar1;
  pointer ppiVar2;
  vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_> *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  if ((this->depth_tasks_).
      super__Vector_base<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->depth_tasks_).
      super__Vector_base<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>::reserve
              (&this->depth_tasks_,
               ((this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->id_ + 1);
    uStack_30 = 0;
    pcStack_20 = std::
                 _Function_handler<void_(transwarp::itask_&),_transwarp::detail::push_task_visitor>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(transwarp::itask_&),_transwarp::detail::push_task_visitor>::
               _M_manager;
    local_38 = &this->depth_tasks_;
    (*(this->super_task<void>).super_itask._vptr_itask[0x32])(this);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,3);
    }
    (*(this->super_task<void>).super_itask._vptr_itask[0x33])(this);
  }
  ppiVar1 = (this->depth_tasks_).
            super__Vector_base<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar2 = (this->depth_tasks_).
                 super__Vector_base<transwarp::itask_*,_std::allocator<transwarp::itask_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppiVar2 != ppiVar1; ppiVar2 = ppiVar2 + 1) {
    add_listener_per_event_visitor::operator()(visitor,*ppiVar2);
  }
  return;
}

Assistant:

void visit_depth_all(Visitor& visitor) {
        if (depth_tasks_.empty()) {
            depth_tasks_.reserve(node_->get_id() + 1);
            visit_depth(transwarp::detail::push_task_visitor(depth_tasks_));
            unvisit();
        }
        for (transwarp::itask* task : depth_tasks_) {
            visitor(*task);
        }
    }